

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O1

double __thiscall
jsoncons::basic_staj_event<char>::as_double(basic_staj_event<char> *this,error_code *ec)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int __exponent;
  chars_to f;
  chars_to local_48;
  type_conflict7 local_28;
  
  switch(this->event_type_) {
  case key:
  case string_value:
    detail::chars_to::chars_to(&local_48);
    local_28 = detail::chars_to::operator()(&local_48,(this->value_).string_data_,this->length_);
    if (local_48.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    break;
  default:
    std::error_code::operator=(ec,not_double);
    local_28 = 0.0;
    break;
  case int64_value:
    local_28 = (type_conflict7)(this->value_).int64_value_;
    break;
  case uint64_value:
    local_28 = ((double)CONCAT44(0x45300000,(int)((ulong)(this->value_).int64_value_ >> 0x20)) -
               1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)(this->value_).int64_value_) - 4503599627370496.0);
    break;
  case half_value:
    uVar1 = (this->value_).half_value_;
    uVar3 = uVar1 >> 10 & 0x1f;
    uVar2 = uVar1 & 0x3ff;
    if (uVar3 == 0x1f) {
      if ((uVar1 & 0x3ff) == 0) {
        local_28 = INFINITY;
      }
      else {
        local_28 = nan("");
      }
    }
    else {
      if ((uVar1 >> 10 & 0x1f) == 0) {
        __exponent = -0x18;
      }
      else {
        uVar2 = uVar2 | 0x400;
        __exponent = uVar3 - 0x19;
      }
      local_28 = ldexp((double)uVar2,__exponent);
    }
    if ((short)uVar1 < 0) {
      local_28 = -local_28;
    }
    break;
  case double_value:
    local_28 = (type_conflict7)(this->value_).int64_value_;
  }
  return local_28;
}

Assistant:

double as_double(std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::key:
            case staj_event_type::string_value:
            {
                jsoncons::detail::chars_to f;
                return f(value_.string_data_, length_);
            }
            case staj_event_type::double_value:
                return value_.double_value_;
            case staj_event_type::int64_value:
                return static_cast<double>(value_.int64_value_);
            case staj_event_type::uint64_value:
                return static_cast<double>(value_.uint64_value_);
            case staj_event_type::half_value:
            {
                double x = binary::decode_half(value_.half_value_);
                return static_cast<double>(x);
            }
            default:
                ec = conv_errc::not_double;
                return double();
        }
    }